

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseGameInfo(FMapInfoParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  FName *pFVar5;
  char *pcVar6;
  FString *pFVar7;
  FString local_d8;
  FString colorName_3;
  FString color_3;
  char *colon_2;
  FString colorName_2;
  FString color_2;
  FString colorName_1;
  FString color_1;
  FString colorName;
  FString color;
  char *colon_1;
  char *colon;
  int i_1;
  FString *graphics [8];
  staticgameborder_t *b;
  int local_28;
  FName val;
  int i;
  FString local_18;
  FString nextKey;
  FMapInfoParser *this_local;
  
  nextKey.Chars = (char *)this;
  FScanner::MustGetToken(&this->sc,0x7b);
  while ((bVar1 = FScanner::GetToken(&this->sc), bVar1 && ((this->sc).TokenType != 0x7d))) {
    FScanner::TokenMustBe(&this->sc,0x101);
    FString::FString(&local_18,(this->sc).String);
    FScanner::MustGetToken(&this->sc,0x3d);
    iVar2 = FString::CompareNoCase(&local_18,"weaponslot");
    if (iVar2 == 0) {
      FScanner::MustGetToken(&this->sc,0x104);
      if (((this->sc).Number < 0) || (9 < (this->sc).Number)) {
        FScanner::ScriptError(&this->sc,"Weapon slot index must be in range [0..9].\n");
      }
      local_28 = (this->sc).Number;
      TArray<FName,_FName>::Clear(gameinfo.DefaultWeaponSlots + local_28);
      FScanner::MustGetToken(&this->sc,0x2c);
      do {
        FScanner::MustGetString(&this->sc);
        FName::FName((FName *)((long)&b + 4),(this->sc).String);
        TArray<FName,_FName>::Push(gameinfo.DefaultWeaponSlots + local_28,(FName *)((long)&b + 4));
        bVar1 = FScanner::CheckToken(&this->sc,0x2c);
      } while (bVar1);
    }
    else {
      iVar2 = FString::CompareNoCase(&local_18,"border");
      if (iVar2 == 0) {
        bVar1 = FScanner::CheckToken(&this->sc,0x101);
        if (bVar1) {
          iVar2 = FScanner::MustMatchString(&this->sc,GameInfoBorders,8);
          if (iVar2 == 1) {
            graphics[7] = (FString *)&HereticBorder;
          }
          else if (iVar2 == 2) {
            graphics[7] = (FString *)&StrifeBorder;
          }
          else {
            graphics[7] = (FString *)&DoomBorder;
          }
          gameborder_t::operator=(&gameinfo.Border,(staticgameborder_t *)graphics[7]);
        }
        else {
          graphics[5] = &gameinfo.Border.b;
          graphics[6] = &gameinfo.Border.bl;
          graphics[3] = &gameinfo.Border.l;
          graphics[4] = &gameinfo.Border.br;
          graphics[1] = &gameinfo.Border.tl;
          graphics[2] = &gameinfo.Border.r;
          graphics[0] = &gameinfo.Border.t;
          FScanner::MustGetToken(&this->sc,0x104);
          gameinfo.Border.offset = (BYTE)(this->sc).Number;
          FScanner::MustGetToken(&this->sc,0x2c);
          FScanner::MustGetToken(&this->sc,0x104);
          gameinfo.Border.size = (BYTE)(this->sc).Number;
          for (colon._4_4_ = 0; colon._4_4_ < 8; colon._4_4_ = colon._4_4_ + 1) {
            FScanner::MustGetToken(&this->sc,0x2c);
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(graphics[(long)colon._4_4_ + -1],(this->sc).String);
          }
        }
      }
      else {
        iVar2 = FString::CompareNoCase(&local_18,"armoricons");
        if (iVar2 == 0) {
          FScanner::MustGetToken(&this->sc,0x102);
          FString::operator=(&gameinfo.ArmorIcon1,(this->sc).String);
          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
          if (bVar1) {
            FScanner::MustGetToken(&this->sc,0x106);
            gameinfo.Armor2Percent = (this->sc).Float;
            FScanner::MustGetToken(&this->sc,0x2c);
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(&gameinfo.ArmorIcon2,(this->sc).String);
          }
        }
        else {
          iVar2 = FString::CompareNoCase(&local_18,"maparrow");
          if (iVar2 == 0) {
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(&gameinfo.mMapArrow,(this->sc).String);
            bVar1 = FScanner::CheckToken(&this->sc,0x2c);
            if (bVar1) {
              FScanner::MustGetToken(&this->sc,0x102);
              FString::operator=(&gameinfo.mCheatMapArrow,(this->sc).String);
            }
            else {
              FString::operator=(&gameinfo.mCheatMapArrow,"");
            }
          }
          else {
            iVar2 = FString::CompareNoCase(&local_18,"cheatKey");
            if (iVar2 == 0) {
              FScanner::MustGetToken(&this->sc,0x102);
              FString::operator=(&gameinfo.mCheatKey,(this->sc).String);
            }
            else {
              iVar2 = FString::CompareNoCase(&local_18,"easyKey");
              if (iVar2 == 0) {
                FScanner::MustGetToken(&this->sc,0x102);
                FString::operator=(&gameinfo.mEasyKey,(this->sc).String);
              }
              else {
                iVar2 = FString::CompareNoCase(&local_18,"titlePage");
                if (iVar2 == 0) {
                  FScanner::MustGetToken(&this->sc,0x102);
                  FString::operator=(&gameinfo.TitlePage,(this->sc).String);
                }
                else {
                  iVar2 = FString::CompareNoCase(&local_18,"addcreditPage");
                  if (iVar2 == 0) {
                    do {
                      FScanner::MustGetToken(&this->sc,0x102);
                      sVar4 = strlen((this->sc).String);
                      if (8 < sVar4) {
                        FScanner::ScriptError
                                  (&this->sc,
                                   "Value for \'%s\' can not be longer than %d characters.",
                                   "creditPages",8);
                      }
                      pcVar6 = (this->sc).String;
                      uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.creditPages,1);
                      pFVar5 = TArray<FName,_FName>::operator[](&gameinfo.creditPages,(ulong)uVar3);
                      FName::operator=(pFVar5,pcVar6);
                      bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                    } while (bVar1);
                  }
                  else {
                    iVar2 = FString::CompareNoCase(&local_18,"CreditPage");
                    if (iVar2 == 0) {
                      TArray<FName,_FName>::Clear(&gameinfo.creditPages);
                      do {
                        FScanner::MustGetToken(&this->sc,0x102);
                        sVar4 = strlen((this->sc).String);
                        if (8 < sVar4) {
                          FScanner::ScriptError
                                    (&this->sc,
                                     "Value for \'%s\' can not be longer than %d characters.",
                                     "creditPages",8);
                        }
                        pcVar6 = (this->sc).String;
                        uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.creditPages,1);
                        pFVar5 = TArray<FName,_FName>::operator[]
                                           (&gameinfo.creditPages,(ulong)uVar3);
                        FName::operator=(pFVar5,pcVar6);
                        bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                      } while (bVar1);
                    }
                    else {
                      iVar2 = FString::CompareNoCase(&local_18,"addplayerclasses");
                      if (iVar2 == 0) {
                        do {
                          FScanner::MustGetToken(&this->sc,0x102);
                          pcVar6 = (this->sc).String;
                          uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.PlayerClasses,1);
                          pFVar5 = TArray<FName,_FName>::operator[]
                                             (&gameinfo.PlayerClasses,(ulong)uVar3);
                          FName::operator=(pFVar5,pcVar6);
                          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                        } while (bVar1);
                      }
                      else {
                        iVar2 = FString::CompareNoCase(&local_18,"playerclasses");
                        if (iVar2 == 0) {
                          TArray<FName,_FName>::Clear(&gameinfo.PlayerClasses);
                          do {
                            FScanner::MustGetToken(&this->sc,0x102);
                            pcVar6 = (this->sc).String;
                            uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.PlayerClasses,1);
                            pFVar5 = TArray<FName,_FName>::operator[]
                                               (&gameinfo.PlayerClasses,(ulong)uVar3);
                            FName::operator=(pFVar5,pcVar6);
                            bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                          } while (bVar1);
                        }
                        else {
                          iVar2 = FString::CompareNoCase(&local_18,"titleMusic");
                          if (iVar2 == 0) {
                            FScanner::MustGetToken(&this->sc,0x102);
                            gameinfo.titleOrder = 0;
                            pcVar6 = strchr((this->sc).String,0x3a);
                            if (pcVar6 != (char *)0x0) {
                              gameinfo.titleOrder = atoi(pcVar6 + 1);
                              *pcVar6 = '\0';
                            }
                            FString::operator=(&gameinfo.titleMusic,(this->sc).String);
                          }
                          else {
                            iVar2 = FString::CompareNoCase(&local_18,"titleTime");
                            if (iVar2 == 0) {
                              FScanner::MustGetFloat(&this->sc);
                              gameinfo.titleTime = (float)(this->sc).Float;
                            }
                            else {
                              iVar2 = FString::CompareNoCase(&local_18,"advisoryTime");
                              if (iVar2 == 0) {
                                FScanner::MustGetFloat(&this->sc);
                                gameinfo.advisoryTime = (float)(this->sc).Float;
                              }
                              else {
                                iVar2 = FString::CompareNoCase(&local_18,"pageTime");
                                if (iVar2 == 0) {
                                  FScanner::MustGetFloat(&this->sc);
                                  gameinfo.pageTime = (float)(this->sc).Float;
                                }
                                else {
                                  iVar2 = FString::CompareNoCase(&local_18,"chatSound");
                                  if (iVar2 == 0) {
                                    FScanner::MustGetToken(&this->sc,0x102);
                                    FString::operator=(&gameinfo.chatSound,(this->sc).String);
                                  }
                                  else {
                                    iVar2 = FString::CompareNoCase(&local_18,"finaleMusic");
                                    if (iVar2 == 0) {
                                      FScanner::MustGetToken(&this->sc,0x102);
                                      gameinfo.finaleOrder = 0;
                                      pcVar6 = strchr((this->sc).String,0x3a);
                                      if (pcVar6 != (char *)0x0) {
                                        gameinfo.finaleOrder = atoi(pcVar6 + 1);
                                        *pcVar6 = '\0';
                                      }
                                      FString::operator=(&gameinfo.finaleMusic,(this->sc).String);
                                    }
                                    else {
                                      iVar2 = FString::CompareNoCase(&local_18,"finaleFlat");
                                      if (iVar2 == 0) {
                                        FScanner::MustGetToken(&this->sc,0x102);
                                        FString::operator=(&gameinfo.FinaleFlat,(this->sc).String);
                                      }
                                      else {
                                        iVar2 = FString::CompareNoCase(&local_18,"finalePage");
                                        if (iVar2 == 0) {
                                          TArray<FName,_FName>::Clear(&gameinfo.finalePages);
                                          do {
                                            FScanner::MustGetToken(&this->sc,0x102);
                                            sVar4 = strlen((this->sc).String);
                                            if (8 < sVar4) {
                                              FScanner::ScriptError
                                                        (&this->sc,
                                                                                                                  
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"finalePages",8);
                                            }
                                            pcVar6 = (this->sc).String;
                                            uVar3 = TArray<FName,_FName>::Reserve
                                                              (&gameinfo.finalePages,1);
                                            pFVar5 = TArray<FName,_FName>::operator[]
                                                               (&gameinfo.finalePages,(ulong)uVar3);
                                            FName::operator=(pFVar5,pcVar6);
                                            bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                          } while (bVar1);
                                        }
                                        else {
                                          iVar2 = FString::CompareNoCase(&local_18,"addinfoPage");
                                          if (iVar2 == 0) {
                                            do {
                                              FScanner::MustGetToken(&this->sc,0x102);
                                              sVar4 = strlen((this->sc).String);
                                              if (8 < sVar4) {
                                                FScanner::ScriptError
                                                          (&this->sc,
                                                                                                                      
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                              }
                                              pcVar6 = (this->sc).String;
                                              uVar3 = TArray<FName,_FName>::Reserve
                                                                (&gameinfo.infoPages,1);
                                              pFVar5 = TArray<FName,_FName>::operator[]
                                                                 (&gameinfo.infoPages,(ulong)uVar3);
                                              FName::operator=(pFVar5,pcVar6);
                                              bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                            } while (bVar1);
                                          }
                                          else {
                                            iVar2 = FString::CompareNoCase(&local_18,"infoPage");
                                            if (iVar2 == 0) {
                                              TArray<FName,_FName>::Clear(&gameinfo.infoPages);
                                              do {
                                                FScanner::MustGetToken(&this->sc,0x102);
                                                sVar4 = strlen((this->sc).String);
                                                if (8 < sVar4) {
                                                  FScanner::ScriptError
                                                            (&this->sc,
                                                                                                                          
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                                }
                                                pcVar6 = (this->sc).String;
                                                uVar3 = TArray<FName,_FName>::Reserve
                                                                  (&gameinfo.infoPages,1);
                                                pFVar5 = TArray<FName,_FName>::operator[]
                                                                   (&gameinfo.infoPages,(ulong)uVar3
                                                                   );
                                                FName::operator=(pFVar5,pcVar6);
                                                bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                              } while (bVar1);
                                            }
                                            else {
                                              iVar2 = FString::CompareNoCase(&local_18,"pausesign");
                                              if (iVar2 == 0) {
                                                FScanner::MustGetToken(&this->sc,0x102);
                                                FString::operator=(&gameinfo.PauseSign,
                                                                   (this->sc).String);
                                              }
                                              else {
                                                iVar2 = FString::CompareNoCase
                                                                  (&local_18,"quitSound");
                                                if (iVar2 == 0) {
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  FString::operator=(&gameinfo.quitSound,
                                                                     (this->sc).String);
                                                }
                                                else {
                                                  iVar2 = FString::CompareNoCase
                                                                    (&local_18,"borderFlat");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FString::operator=(&gameinfo.BorderFlat,
                                                                       (this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"telefogheight");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetFloat(&this->sc);
                                                      gameinfo.telefogheight = (this->sc).Float;
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,"gibfactor");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetFloat(&this->sc);
                                                        gameinfo.gibfactor = (this->sc).Float;
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,"defKickback");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetNumber(&this->sc);
                                                          gameinfo.defKickback = (this->sc).Number;
                                                        }
                                                        else {
                                                          iVar2 = FString::CompareNoCase
                                                                            (&local_18,"SkyFlatName"
                                                                            );
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            FString::operator=(&gameinfo.SkyFlatName
                                                                               ,(this->sc).String);
                                                          }
                                                          else {
                                                            iVar2 = FString::CompareNoCase
                                                                              (&local_18,
                                                                               "translator");
                                                            if (iVar2 == 0) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              FString::operator=(&gameinfo.
                                                  translator,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"pickupcolor");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FString::FString(&colorName,(this->sc).String)
                                                      ;
                                                      FString::operator_cast_to_char_(&colorName);
                                                      V_GetColorStringByName((char *)&color_1);
                                                      bVar1 = FString::IsEmpty(&color_1);
                                                      if (!bVar1) {
                                                        FString::operator=(&colorName,&color_1);
                                                      }
                                                      pcVar6 = FString::operator_cast_to_char_
                                                                         (&colorName);
                                                      gameinfo.pickupcolor =
                                                           V_GetColorFromString((DWORD *)0x0,pcVar6)
                                                      ;
                                                      FString::~FString(&color_1);
                                                      FString::~FString(&colorName);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,
                                                                         "defaultbloodcolor");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FString::FString(&colorName_1,
                                                                         (this->sc).String);
                                                        FString::operator_cast_to_char_
                                                                  (&colorName_1);
                                                        V_GetColorStringByName((char *)&color_2);
                                                        bVar1 = FString::IsEmpty(&color_2);
                                                        if (!bVar1) {
                                                          FString::operator=(&colorName_1,&color_2);
                                                        }
                                                        pcVar6 = FString::operator_cast_to_char_
                                                                           (&colorName_1);
                                                        gameinfo.defaultbloodcolor =
                                                             V_GetColorFromString
                                                                       ((DWORD *)0x0,pcVar6);
                                                        FString::~FString(&color_2);
                                                        FString::~FString(&colorName_1);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,
                                                                                                                                                      
                                                  "defaultbloodparticlecolor");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FString::FString(&colorName_2,(this->sc).String)
                                                    ;
                                                    FString::operator_cast_to_char_(&colorName_2);
                                                    V_GetColorStringByName((char *)&colon_2);
                                                    bVar1 = FString::IsEmpty((FString *)&colon_2);
                                                    if (!bVar1) {
                                                      FString::operator=(&colorName_2,
                                                                         (FString *)&colon_2);
                                                    }
                                                    pcVar6 = FString::operator_cast_to_char_
                                                                       (&colorName_2);
                                                    gameinfo.defaultbloodparticlecolor =
                                                         V_GetColorFromString((DWORD *)0x0,pcVar6);
                                                    FString::~FString((FString *)&colon_2);
                                                    FString::~FString(&colorName_2);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"backpacktype");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FString::operator=(&gameinfo.backpacktype,
                                                                         (this->sc).String);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,"statusbar");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FString::operator=(&gameinfo.statusbar,
                                                                           (this->sc).String);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,
                                                                           "intermissionMusic");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          gameinfo.intermissionOrder = 0;
                                                          pcVar6 = strchr((this->sc).String,0x3a);
                                                          if (pcVar6 != (char *)0x0) {
                                                            gameinfo.intermissionOrder =
                                                                 atoi(pcVar6 + 1);
                                                            *pcVar6 = '\0';
                                                          }
                                                          FString::operator=(&gameinfo.
                                                  intermissionMusic,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"CursorPic");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FString::operator=(&gameinfo.CursorPic,
                                                                         (this->sc).String);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,
                                                                         "noloopfinalemusic");
                                                      if (iVar2 == 0) {
                                                        bVar1 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (!bVar1) {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                        }
                                                        gameinfo.noloopfinalemusic = !bVar1;
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,"drawreadthis")
                                                        ;
                                                        if (iVar2 == 0) {
                                                          bVar1 = FScanner::CheckToken
                                                                            (&this->sc,0x14c);
                                                          if (!bVar1) {
                                                            FScanner::MustGetToken(&this->sc,0x14b);
                                                          }
                                                          gameinfo.drawreadthis = !bVar1;
                                                        }
                                                        else {
                                                          iVar2 = FString::CompareNoCase
                                                                            (&local_18,"swapmenu");
                                                          if (iVar2 == 0) {
                                                            bVar1 = FScanner::CheckToken
                                                                              (&this->sc,0x14c);
                                                            if (!bVar1) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x14b);
                                                            }
                                                            gameinfo.swapmenu = !bVar1;
                                                          }
                                                          else {
                                                            iVar2 = FString::CompareNoCase
                                                                              (&local_18,
                                                                               "dontcrunchcorpses");
                                                            if (iVar2 == 0) {
                                                              bVar1 = FScanner::CheckToken
                                                                                (&this->sc,0x14c);
                                                              if (!bVar1) {
                                                                FScanner::MustGetToken
                                                                          (&this->sc,0x14b);
                                                              }
                                                              gameinfo.dontcrunchcorpses = !bVar1;
                                                            }
                                                            else {
                                                              iVar2 = FString::CompareNoCase
                                                                                (&local_18,
                                                                                                                                                                  
                                                  "intermissioncounter");
                                                  if (iVar2 == 0) {
                                                    bVar1 = FScanner::CheckToken(&this->sc,0x14c);
                                                    if (!bVar1) {
                                                      FScanner::MustGetToken(&this->sc,0x14b);
                                                    }
                                                    gameinfo.intermissioncounter = !bVar1;
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"nightmarefast");
                                                    if (iVar2 == 0) {
                                                      bVar1 = FScanner::CheckToken(&this->sc,0x14c);
                                                      if (!bVar1) {
                                                        FScanner::MustGetToken(&this->sc,0x14b);
                                                      }
                                                      gameinfo.nightmarefast = !bVar1;
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,"dimcolor");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FString::FString(&colorName_3,
                                                                         (this->sc).String);
                                                        FString::operator_cast_to_char_
                                                                  (&colorName_3);
                                                        V_GetColorStringByName((char *)&local_d8);
                                                        bVar1 = FString::IsEmpty(&local_d8);
                                                        if (!bVar1) {
                                                          FString::operator=(&colorName_3,&local_d8)
                                                          ;
                                                        }
                                                        pcVar6 = FString::operator_cast_to_char_
                                                                           (&colorName_3);
                                                        gameinfo.dimcolor =
                                                             V_GetColorFromString
                                                                       ((DWORD *)0x0,pcVar6);
                                                        FString::~FString(&local_d8);
                                                        FString::~FString(&colorName_3);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,"dimamount");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetFloat(&this->sc);
                                                          gameinfo.dimamount =
                                                               (float)(this->sc).Float;
                                                        }
                                                        else {
                                                          iVar2 = FString::CompareNoCase
                                                                            (&local_18,
                                                                             "definventorymaxamount"
                                                                            );
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetNumber(&this->sc);
                                                            gameinfo.definventorymaxamount =
                                                                 (this->sc).Number;
                                                          }
                                                          else {
                                                            iVar2 = FString::CompareNoCase
                                                                              (&local_18,
                                                                               "defaultrespawntime")
                                                            ;
                                                            if (iVar2 == 0) {
                                                              FScanner::MustGetNumber(&this->sc);
                                                              gameinfo.defaultrespawntime =
                                                                   (this->sc).Number;
                                                            }
                                                            else {
                                                              iVar2 = FString::CompareNoCase
                                                                                (&local_18,
                                                                                                                                                                  
                                                  "defaultrespawntime");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetNumber(&this->sc);
                                                    gameinfo.defaultrespawntime = (this->sc).Number;
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"defaultdropstyle")
                                                    ;
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetNumber(&this->sc);
                                                      gameinfo.defaultdropstyle = (this->sc).Number;
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,"endoom");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FString::operator=(&gameinfo.Endoom,
                                                                           (this->sc).String);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,
                                                                           "addquitmessages");
                                                        if (iVar2 == 0) {
                                                          do {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            pcVar6 = (this->sc).String;
                                                            uVar3 = TArray<FString,_FString>::
                                                                    Reserve(&gameinfo.quitmessages,1
                                                                           );
                                                            pFVar7 = TArray<FString,_FString>::
                                                                     operator[](&gameinfo.
                                                  quitmessages,(ulong)uVar3);
                                                  FString::operator=(pFVar7,pcVar6);
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  } while (bVar1);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,"quitmessages");
                                                    if (iVar2 == 0) {
                                                      TArray<FString,_FString>::Clear
                                                                (&gameinfo.quitmessages);
                                                      do {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        pcVar6 = (this->sc).String;
                                                        uVar3 = TArray<FString,_FString>::Reserve
                                                                          (&gameinfo.quitmessages,1)
                                                        ;
                                                        pFVar7 = TArray<FString,_FString>::
                                                                 operator[](&gameinfo.quitmessages,
                                                                            (ulong)uVar3);
                                                        FString::operator=(pFVar7,pcVar6);
                                                        bVar1 = FScanner::CheckToken(&this->sc,0x2c)
                                                        ;
                                                      } while (bVar1);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,
                                                                         "menufontcolor_title");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FName::operator=(&gameinfo.mTitleColor,
                                                                         (this->sc).String);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,
                                                                           "menufontcolor_label");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          FName::operator=(&gameinfo.mFontColor,
                                                                           (this->sc).String);
                                                        }
                                                        else {
                                                          iVar2 = FString::CompareNoCase
                                                                            (&local_18,
                                                                             "menufontcolor_value");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            FName::operator=(&gameinfo.
                                                  mFontColorValue,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "menufontcolor_action");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.mFontColorMore,
                                                                       (this->sc).String);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,
                                                                         "menufontcolor_header");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FName::operator=(&gameinfo.mFontColorHeader,
                                                                         (this->sc).String);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,
                                                                           "menufontcolor_highlight"
                                                                          );
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          FName::operator=(&gameinfo.
                                                  mFontColorHighlight,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "menufontcolor_selection");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.mFontColorSelection
                                                                       ,(this->sc).String);
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,"menubackbutton")
                                                      ;
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        FString::operator=(&gameinfo.mBackButton,
                                                                           (this->sc).String);
                                                      }
                                                      else {
                                                        iVar2 = FString::CompareNoCase
                                                                          (&local_18,"textscreenx");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetNumber(&this->sc);
                                                          gameinfo.TextScreenX = (this->sc).Number;
                                                        }
                                                        else {
                                                          iVar2 = FString::CompareNoCase
                                                                            (&local_18,"textscreeny"
                                                                            );
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetNumber(&this->sc);
                                                            gameinfo.TextScreenY = (this->sc).Number
                                                            ;
                                                          }
                                                          else {
                                                            iVar2 = FString::CompareNoCase
                                                                              (&local_18,
                                                                               "defaultendsequence")
                                                            ;
                                                            if (iVar2 == 0) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              FName::operator=(&gameinfo.
                                                  DefaultEndSequence,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "statscreen_mapnamefont");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenMapNameFont.fontname,(this->sc).String)
                                                  ;
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenMapNameFont.color,(this->sc).String);
                                                  }
                                                  else {
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenMapNameFont.color,NAME_None);
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "statscreen_finishedfont");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.fontname,(this->sc).String
                                                  );
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.color,(this->sc).String);
                                                  }
                                                  else {
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.color,NAME_None);
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "statscreen_enteringfont");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.fontname,(this->sc).String
                                                  );
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.color,(this->sc).String);
                                                  }
                                                  else {
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.color,NAME_None);
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "statscreen_finishedpatch");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.fontname,(this->sc).String
                                                  );
                                                  FName::operator=(&gameinfo.mStatscreenFinishedFont
                                                                    .color,NAME_Null);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "statscreen_enteringpatch");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.fontname,(this->sc).String
                                                  );
                                                  FName::operator=(&gameinfo.mStatscreenEnteringFont
                                                                    .color,NAME_Null);
                                                  }
                                                  else {
                                                    iVar2 = FString::CompareNoCase
                                                                      (&local_18,
                                                                       "norandomplayerclass");
                                                    if (iVar2 == 0) {
                                                      bVar1 = FScanner::CheckToken(&this->sc,0x14c);
                                                      if (!bVar1) {
                                                        FScanner::MustGetToken(&this->sc,0x14b);
                                                      }
                                                      gameinfo.norandomplayerclass = !bVar1;
                                                    }
                                                    else {
                                                      iVar2 = FString::CompareNoCase
                                                                        (&local_18,
                                                                         "forcekillscripts");
                                                      if (iVar2 == 0) {
                                                        bVar1 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (!bVar1) {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                        }
                                                        gameinfo.forcekillscripts = !bVar1;
                                                      }
                                                      else {
                                                        FScanner::UnGet(&this->sc);
                                                        SkipToNext(this);
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    FString::~FString(&local_18);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseGameInfo()
{
	sc.MustGetToken('{');
	while(sc.GetToken())
	{
		if (sc.TokenType == '}') return;

		sc.TokenMustBe(TK_Identifier);
		FString nextKey = sc.String;
		sc.MustGetToken('=');

		if (nextKey.CompareNoCase("weaponslot") == 0)
		{
			sc.MustGetToken(TK_IntConst);
			if (sc.Number < 0 || sc.Number >= 10)
			{
				sc.ScriptError("Weapon slot index must be in range [0..9].\n");
			}
			int i = sc.Number;
			gameinfo.DefaultWeaponSlots[i].Clear();
			sc.MustGetToken(',');
			do
			{
				sc.MustGetString();
				FName val = sc.String;
				gameinfo.DefaultWeaponSlots[i].Push(val);

			}
			while (sc.CheckToken(','));
		}
		else if(nextKey.CompareNoCase("border") == 0)
		{
			staticgameborder_t *b;
			if (sc.CheckToken(TK_Identifier))
			{
				switch(sc.MustMatchString(GameInfoBorders))
				{
					default:
						b = &DoomBorder;
						break;
					case 1:
						b = &HereticBorder;
						break;
					case 2:
						b = &StrifeBorder;
						break;
				}
				gameinfo.Border = *b;
			}
			else
			{
				// border = {size, offset, tr, t, tl, r, l ,br, b, bl};
				FString *graphics[8] = { &gameinfo.Border.tr, &gameinfo.Border.t, &gameinfo.Border.tl, &gameinfo.Border.r, &gameinfo.Border.l, &gameinfo.Border.br, &gameinfo.Border.b, &gameinfo.Border.bl };
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.offset = sc.Number;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.size = sc.Number;
				for(int i = 0;i < 8;i++)
				{
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					(*graphics[i]) = sc.String;
				}
			}
		}
		else if(nextKey.CompareNoCase("armoricons") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.ArmorIcon1 = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_FloatConst);
				gameinfo.Armor2Percent = sc.Float;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_StringConst);
				gameinfo.ArmorIcon2 = sc.String;
			}
		}
		else if(nextKey.CompareNoCase("maparrow") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.mMapArrow = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_StringConst);
				gameinfo.mCheatMapArrow = sc.String;
			}
			else gameinfo.mCheatMapArrow = "";
		}
		// Insert valid keys here.
		GAMEINFOKEY_STRING(mCheatKey, "cheatKey")
		GAMEINFOKEY_STRING(mEasyKey, "easyKey")
		GAMEINFOKEY_STRING(TitlePage, "titlePage")
		GAMEINFOKEY_STRINGARRAY(creditPages, "addcreditPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(creditPages, "CreditPage", 8, true)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "addplayerclasses", 0, false)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "playerclasses", 0, true)
		GAMEINFOKEY_MUSIC(titleMusic, titleOrder, "titleMusic")
		GAMEINFOKEY_FLOAT(titleTime, "titleTime")
		GAMEINFOKEY_FLOAT(advisoryTime, "advisoryTime")
		GAMEINFOKEY_FLOAT(pageTime, "pageTime")
		GAMEINFOKEY_STRING(chatSound, "chatSound")
		GAMEINFOKEY_MUSIC(finaleMusic, finaleOrder, "finaleMusic")
		GAMEINFOKEY_STRING(FinaleFlat, "finaleFlat")
		GAMEINFOKEY_STRINGARRAY(finalePages, "finalePage", 8, true)
		GAMEINFOKEY_STRINGARRAY(infoPages, "addinfoPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(infoPages, "infoPage", 8, true)
		GAMEINFOKEY_STRING(PauseSign, "pausesign")
		GAMEINFOKEY_STRING(quitSound, "quitSound")
		GAMEINFOKEY_STRING(BorderFlat, "borderFlat")
		GAMEINFOKEY_DOUBLE(telefogheight, "telefogheight")
		GAMEINFOKEY_DOUBLE(gibfactor, "gibfactor")
		GAMEINFOKEY_INT(defKickback, "defKickback")
		GAMEINFOKEY_STRING(SkyFlatName, "SkyFlatName")
		GAMEINFOKEY_STRING(translator, "translator")
		GAMEINFOKEY_COLOR(pickupcolor, "pickupcolor")
		GAMEINFOKEY_COLOR(defaultbloodcolor, "defaultbloodcolor")
		GAMEINFOKEY_COLOR(defaultbloodparticlecolor, "defaultbloodparticlecolor")
		GAMEINFOKEY_STRING(backpacktype, "backpacktype")
		GAMEINFOKEY_STRING(statusbar, "statusbar")
		GAMEINFOKEY_MUSIC(intermissionMusic, intermissionOrder, "intermissionMusic")
		GAMEINFOKEY_STRING(CursorPic, "CursorPic")
		GAMEINFOKEY_BOOL(noloopfinalemusic, "noloopfinalemusic")
		GAMEINFOKEY_BOOL(drawreadthis, "drawreadthis")
		GAMEINFOKEY_BOOL(swapmenu, "swapmenu")
		GAMEINFOKEY_BOOL(dontcrunchcorpses, "dontcrunchcorpses")
		GAMEINFOKEY_BOOL(intermissioncounter, "intermissioncounter")
		GAMEINFOKEY_BOOL(nightmarefast, "nightmarefast")
		GAMEINFOKEY_COLOR(dimcolor, "dimcolor")
		GAMEINFOKEY_FLOAT(dimamount, "dimamount")
		GAMEINFOKEY_INT(definventorymaxamount, "definventorymaxamount")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultdropstyle, "defaultdropstyle")
		GAMEINFOKEY_STRING(Endoom, "endoom")
		GAMEINFOKEY_STRINGARRAY(quitmessages, "addquitmessages", 0, false)
		GAMEINFOKEY_STRINGARRAY(quitmessages, "quitmessages", 0, true)
		GAMEINFOKEY_STRING(mTitleColor, "menufontcolor_title")
		GAMEINFOKEY_STRING(mFontColor, "menufontcolor_label")
		GAMEINFOKEY_STRING(mFontColorValue, "menufontcolor_value")
		GAMEINFOKEY_STRING(mFontColorMore, "menufontcolor_action")
		GAMEINFOKEY_STRING(mFontColorHeader, "menufontcolor_header")
		GAMEINFOKEY_STRING(mFontColorHighlight, "menufontcolor_highlight")
		GAMEINFOKEY_STRING(mFontColorSelection, "menufontcolor_selection")
		GAMEINFOKEY_STRING(mBackButton, "menubackbutton")
		GAMEINFOKEY_INT(TextScreenX, "textscreenx")
		GAMEINFOKEY_INT(TextScreenY, "textscreeny")
		GAMEINFOKEY_STRING(DefaultEndSequence, "defaultendsequence")
		GAMEINFOKEY_FONT(mStatscreenMapNameFont, "statscreen_mapnamefont")
		GAMEINFOKEY_FONT(mStatscreenFinishedFont, "statscreen_finishedfont")
		GAMEINFOKEY_FONT(mStatscreenEnteringFont, "statscreen_enteringfont")
		GAMEINFOKEY_PATCH(mStatscreenFinishedFont, "statscreen_finishedpatch")
		GAMEINFOKEY_PATCH(mStatscreenEnteringFont, "statscreen_enteringpatch")
		GAMEINFOKEY_BOOL(norandomplayerclass, "norandomplayerclass")
		GAMEINFOKEY_BOOL(forcekillscripts, "forcekillscripts") // [JM] Force kill scripts on thing death. (MF7_NOKILLSCRIPTS overrides.)

		else
		{
			// ignore unkown keys.
			sc.UnGet();
			SkipToNext();
		}
	}